

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omd2omd.cpp
# Opt level: O0

void createMdFile(string *oldMdFileName,string *newMdFileName,
                 vector<int,_std::allocator<int>_> *nMol)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  uint *puVar4;
  ostream *poVar5;
  size_type sVar6;
  vector<int,_std::allocator<int>_> *in_RDX;
  size_t i;
  char buffer [65535];
  int MAXLEN;
  ofstream newMdFile;
  ifstream oldMdFile;
  size_type in_stack_fffffffffffefb78;
  errorStruct *peVar7;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffefb80;
  ulong uStack_10440;
  char acStack_10438 [65560];
  ostream local_420 [512];
  char local_220 [544];
  
  std::ifstream::ifstream(local_220);
  std::ofstream::ofstream(local_420);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open(local_220,_Var2);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)local_420,_Var2);
  std::istream::getline(local_220,(long)acStack_10438);
  uStack_10440 = 0;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    pcVar3 = strstr(acStack_10438,"nMol");
    if (pcVar3 == (char *)0x0) {
      poVar5 = std::operator<<(local_420,acStack_10438);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
      if (uStack_10440 < sVar6) {
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                   (in_stack_fffffffffffefb80,in_stack_fffffffffffefb78);
        snprintf(acStack_10438,0xffff,"\tnMol = %i;",(ulong)*puVar4);
        poVar5 = std::operator<<(local_420,acStack_10438);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        uStack_10440 = uStack_10440 + 1;
      }
    }
    std::istream::getline(local_220,(long)acStack_10438);
  }
  std::ifstream::close();
  std::ofstream::close();
  sVar6 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  if (uStack_10440 != sVar6) {
    peVar7 = &painCave;
    snprintf(painCave.errMsg,2000,
             "Couldn\'t replace the correct number of nMol\n\tstatements in component blocks.");
    peVar7->isFatal = 1;
    simError();
  }
  std::ofstream::~ofstream(local_420);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void createMdFile(const std::string& oldMdFileName,
                  const std::string& newMdFileName, std::vector<int> nMol) {
  ifstream oldMdFile;
  ofstream newMdFile;
  const int MAXLEN = 65535;
  char buffer[MAXLEN];

  // create new .omd file based on old .omd file

  oldMdFile.open(oldMdFileName.c_str());
  newMdFile.open(newMdFileName.c_str());

  oldMdFile.getline(buffer, MAXLEN);

  std::size_t i = 0;
  while (!oldMdFile.eof()) {
    // correct molecule number
    if (strstr(buffer, "nMol") != NULL) {
      if (i < nMol.size()) {
        snprintf(buffer, MAXLEN, "\tnMol = %i;", nMol.at(i));
        newMdFile << buffer << std::endl;
        i++;
      }
    } else
      newMdFile << buffer << std::endl;

    oldMdFile.getline(buffer, MAXLEN);
  }

  oldMdFile.close();
  newMdFile.close();

  if (i != nMol.size()) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Couldn't replace the correct number of nMol\n"
             "\tstatements in component blocks.");
    painCave.isFatal = 1;
    simError();
  }
}